

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O2

int kvtree_util_get_int(kvtree *hash,char *key,int *value)

{
  int iVar1;
  char *__nptr;
  
  __nptr = kvtree_elem_get_first_val(hash,key);
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    *value = iVar1;
  }
  return (uint)(__nptr == (char *)0x0);
}

Assistant:

int kvtree_util_get_int(const kvtree* hash, const char* key, int* value)
{
  int rc = KVTREE_FAILURE;

  char* val_str = kvtree_elem_get_first_val(hash, key);
  if (val_str != NULL) {
    *value = atoi(val_str);
    return KVTREE_SUCCESS;
  }

  return rc;
}